

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::Log2Op>,_rsg::ComputeUnaryBuiltinVecRange<rsg::Log2Op>,_rsg::EvaluateUnaryBuiltinVec<rsg::Log2Op>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  float fVar10;
  float local_54;
  float local_50;
  
  fVar6 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar2 = state->m_shaderParams->maxExpressionDepth;
    iVar3 = state->m_expressionDepth;
    iVar4 = getConservativeValueExprDepth(state,valueRange);
    fVar6 = 0.0;
    if (iVar4 + 1 <= iVar2 - iVar3) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar6 = 1.0;
      }
      else {
        fVar6 = 1.0;
        lVar5 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar10 = valueRange.m_min[lVar5].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar7 = 1.0;
          if (-INFINITY < fVar10) {
            fVar1 = valueRange.m_max[lVar5].floatVal;
            fVar7 = 1.0;
            if (fVar1 < INFINITY) {
              bVar9 = fVar10 <= 6.0 && 0.1 <= fVar1;
              if (bVar9) {
                fVar7 = fVar10;
                if (fVar10 <= 0.1) {
                  fVar7 = 0.1;
                }
                local_54 = expf(fVar7 * 0.6931472);
                fVar7 = fVar1;
                if (6.0 <= fVar1) {
                  fVar7 = 6.0;
                }
                local_50 = expf(fVar7 * 0.6931472);
              }
              fVar7 = 0.0;
              if (bVar9) {
                fVar7 = ceilf(local_54 * 8.0);
                fVar7 = fVar7 * 0.125;
                if (fVar7 <= local_50) {
                  fVar8 = floorf(local_50 * 8.0);
                  bVar9 = fVar7 <= fVar8 * 0.125;
                  local_54 = fVar7;
                  if (bVar9) {
                    local_50 = fVar8 * 0.125;
                  }
                }
                else {
                  bVar9 = false;
                }
                fVar7 = 0.0;
                if (bVar9) {
                  if ((fVar10 != fVar1) || (fVar7 = 1.0, NAN(fVar10) || NAN(fVar1))) {
                    fVar7 = logf(local_50);
                    local_50 = fVar7 * 1.442695;
                    fVar7 = logf(local_54);
                    fVar10 = (local_50 - fVar7 * 1.442695) / (fVar1 - fVar10);
                    fVar7 = 0.1;
                    if (0.1 <= fVar10) {
                      fVar7 = fVar10;
                    }
                  }
                }
              }
            }
          }
          fVar6 = fVar6 * fVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar6;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}